

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_huffman_init(huffman *hf,size_t len_size,wchar_t tbl_bits)

{
  uchar *puVar1;
  uint16_t *puVar2;
  htree_t *phVar3;
  wchar_t local_28;
  wchar_t bits;
  wchar_t tbl_bits_local;
  size_t len_size_local;
  huffman *hf_local;
  
  if ((hf->bitlen == (uchar *)0x0) || (hf->len_size != (wchar_t)len_size)) {
    free(hf->bitlen);
    puVar1 = (uchar *)calloc(len_size,1);
    hf->bitlen = puVar1;
    if (hf->bitlen == (uchar *)0x0) {
      return L'\xffffffe2';
    }
    hf->len_size = (wchar_t)len_size;
  }
  else {
    memset(hf->bitlen,0,len_size);
  }
  if (hf->tbl == (uint16_t *)0x0) {
    local_28 = tbl_bits;
    if (L'\t' < tbl_bits) {
      local_28 = L'\n';
    }
    puVar2 = (uint16_t *)malloc((1L << ((byte)local_28 & 0x3f)) << 1);
    hf->tbl = puVar2;
    if (hf->tbl == (uint16_t *)0x0) {
      return L'\xffffffe2';
    }
    hf->tbl_bits = tbl_bits;
  }
  if ((hf->tree == (htree_t *)0x0) && (L'\n' < tbl_bits)) {
    hf->tree_avail = 1 << ((char)tbl_bits - 6U & 0x1f);
    phVar3 = (htree_t *)malloc((long)hf->tree_avail << 2);
    hf->tree = phVar3;
    if (hf->tree == (htree_t *)0x0) {
      return L'\xffffffe2';
    }
  }
  return L'\0';
}

Assistant:

static int
lzx_huffman_init(struct huffman *hf, size_t len_size, int tbl_bits)
{
	int bits;

	if (hf->bitlen == NULL || hf->len_size != (int)len_size) {
		free(hf->bitlen);
		hf->bitlen = calloc(len_size,  sizeof(hf->bitlen[0]));
		if (hf->bitlen == NULL)
			return (ARCHIVE_FATAL);
		hf->len_size = (int)len_size;
	} else
		memset(hf->bitlen, 0, len_size *  sizeof(hf->bitlen[0]));
	if (hf->tbl == NULL) {
		if (tbl_bits < HTBL_BITS)
			bits = tbl_bits;
		else
			bits = HTBL_BITS;
		hf->tbl = malloc(((size_t)1 << bits) * sizeof(hf->tbl[0]));
		if (hf->tbl == NULL)
			return (ARCHIVE_FATAL);
		hf->tbl_bits = tbl_bits;
	}
	if (hf->tree == NULL && tbl_bits > HTBL_BITS) {
		hf->tree_avail = 1 << (tbl_bits - HTBL_BITS + 4);
		hf->tree = malloc(hf->tree_avail * sizeof(hf->tree[0]));
		if (hf->tree == NULL)
			return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}